

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Insert
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  bool bVar1;
  int height_00;
  int iVar2;
  Node *pNVar3;
  Node *x_00;
  byte local_ad;
  int local_ac;
  int local_a8;
  int i_1;
  int i;
  int height;
  Node *x;
  Node *prev [12];
  char **key_local;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this_local;
  memory_order __b;
  
  pNVar3 = FindGreaterOrEqual(this,key,&x);
  local_ad = 1;
  if (pNVar3 != (Node *)0x0) {
    bVar1 = Equal(this,key,&pNVar3->key);
    local_ad = bVar1 ^ 0xff;
  }
  if ((local_ad & 1) != 0) {
    height_00 = RandomHeight(this);
    iVar2 = GetMaxHeight(this);
    if (iVar2 < height_00) {
      for (local_a8 = GetMaxHeight(this); local_a8 < height_00; local_a8 = local_a8 + 1) {
        prev[(long)local_a8 + -1] = this->head_;
      }
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (this->max_height_).super___atomic_base<int>._M_i = height_00;
    }
    pNVar3 = NewNode(this,key,height_00);
    for (local_ac = 0; local_ac < height_00; local_ac = local_ac + 1) {
      x_00 = Node::NoBarrier_Next(prev[(long)local_ac + -1],local_ac);
      Node::NoBarrier_SetNext(pNVar3,local_ac,x_00);
      Node::SetNext(prev[(long)local_ac + -1],local_ac,pNVar3);
    }
    return;
  }
  __assert_fail("x == nullptr || !Equal(key, x->key)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/skiplist.h"
                ,0x158,
                "void leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Insert(const Key &) [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
               );
}

Assistant:

void SkipList<Key, Comparator>::Insert(const Key& key) {
  // TODO(opt): We can use a barrier-free variant of FindGreaterOrEqual()
  // here since Insert() is externally synchronized.
  Node* prev[kMaxHeight];
  Node* x = FindGreaterOrEqual(key, prev);

  // Our data structure does not allow duplicate insertion
  assert(x == nullptr || !Equal(key, x->key));

  int height = RandomHeight();
  if (height > GetMaxHeight()) {
    for (int i = GetMaxHeight(); i < height; i++) {
      prev[i] = head_;
    }
    // It is ok to mutate max_height_ without any synchronization
    // with concurrent readers.  A concurrent reader that observes
    // the new value of max_height_ will see either the old value of
    // new level pointers from head_ (nullptr), or a new value set in
    // the loop below.  In the former case the reader will
    // immediately drop to the next level since nullptr sorts after all
    // keys.  In the latter case the reader will use the new node.
    max_height_.store(height, std::memory_order_relaxed);
  }

  x = NewNode(key, height);
  for (int i = 0; i < height; i++) {
    // NoBarrier_SetNext() suffices since we will add a barrier when
    // we publish a pointer to "x" in prev[i].
    x->NoBarrier_SetNext(i, prev[i]->NoBarrier_Next(i));
    prev[i]->SetNext(i, x);
  }
}